

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  cmSourceFile *pcVar4;
  string *psVar5;
  pointer pbVar6;
  pointer pbVar7;
  char *filename;
  const_iterator file;
  allocator local_89;
  string *local_88;
  char *local_80;
  cmSourceFile *local_78;
  string incpath;
  string local_50;
  
  if (info->DependDone == false) {
    info->DependDone = true;
    filename = (info->FullPath)._M_dataplus._M_p;
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      return;
    }
    bVar1 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar1) {
      DependWalk(this,info);
    }
    pcVar4 = info->SourceFile;
    if (pcVar4 != (cmSourceFile *)0x0) {
      pbVar7 = (pcVar4->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (pcVar4->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar7 != pbVar6) {
        for (; pbVar7 != pbVar6; pbVar7 = pbVar7 + 1) {
          AddDependency(this,info,(pbVar7->_M_dataplus)._M_p);
          pbVar6 = (pcVar4->Depends).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        return;
      }
    }
    local_88 = (string *)&info->FullPath;
    if (!bVar1) {
      this_00 = this->Makefile;
      std::__cxx11::string::string((string *)&local_50,filename,&local_89);
      cmsys::SystemTools::GetFilenameWithoutExtension(&incpath,&local_50);
      pcVar4 = cmMakefile::GetSource(this_00,&incpath);
      std::__cxx11::string::~string((string *)&incpath);
      std::__cxx11::string::~string((string *)&local_50);
      if (pcVar4 != (cmSourceFile *)0x0) {
        psVar5 = cmSourceFile::GetFullPath(pcVar4,(string *)0x0);
        bVar2 = std::operator==(psVar5,filename);
        if (bVar2) {
          return;
        }
        local_80 = filename;
        local_78 = pcVar4;
        for (pbVar7 = (this->IncludeDirectories).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; filename = local_80,
            pbVar7 != (this->IncludeDirectories).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
          std::__cxx11::string::string((string *)&incpath,(string *)pbVar7);
          if ((incpath._M_string_length != 0) &&
             (incpath._M_dataplus._M_p[incpath._M_string_length - 1] != '/')) {
            std::operator+(&local_50,&incpath,"/");
            std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::operator+(&local_50,&incpath,local_80);
          std::__cxx11::string::operator=((string *)&incpath,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          psVar5 = cmSourceFile::GetFullPath(local_78,(string *)0x0);
          _Var3 = std::operator==(psVar5,&incpath);
          if (_Var3) {
            bVar1 = true;
            std::__cxx11::string::_M_assign(local_88);
          }
          std::__cxx11::string::~string((string *)&incpath);
        }
      }
    }
    if (!bVar1) {
      bVar1 = cmsys::RegularExpression::find
                        (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p);
      if (bVar1) {
        cmSystemTools::Error("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0)
        ;
      }
      else {
        std::__cxx11::string::assign((char *)local_88);
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const char* path = info->FullPath.c_str();
    if (!path) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != CM_NULLPTR) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::vector<std::string>::const_iterator file =
               cFile.GetDepends().begin();
             file != cFile.GetDepends().end(); ++file) {
          this->AddDependency(info, file->c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::vector<std::string>::iterator t =
                 this->IncludeDirectories.begin();
               t != this->IncludeDirectories.end(); ++t) {
            std::string incpath = *t;
            if (!incpath.empty() && incpath[incpath.size() - 1] != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(
            info->IncludeName.c_str())) {
        cmSystemTools::Error("error cannot find dependencies for ", path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath = "";
      }
    }
  }